

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O2

void __thiscall
t_cl_generator::generate_cl_struct
          (t_cl_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  t_cl_generator *ptVar4;
  string name;
  string local_b0;
  string local_90;
  string local_70;
  
  type_name_abi_cxx11_((string *)&stack0xffffffffffffffb0,this,&tstruct->super_t_type);
  pcVar3 = "(thrift:def-struct ";
  if ((int)CONCAT71(in_register_00000009,is_exception) != 0) {
    pcVar3 = "(thrift:def-exception ";
  }
  poVar2 = std::operator<<(out,pcVar3);
  ptVar4 = (t_cl_generator *)&stack0xffffffffffffffb0;
  std::__cxx11::string::string((string *)&local_70,(string *)ptVar4);
  prefix(&local_b0,ptVar4,&local_70);
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((tstruct->super_t_type).super_t_doc.has_doc_ == true) {
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    std::operator<<(out,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar2 = std::operator<<(out,"\"");
    ptVar4 = (t_cl_generator *)&(tstruct->super_t_type).super_t_doc.doc_;
    std::__cxx11::string::string((string *)&local_90,(string *)ptVar4);
    cl_docstring(&local_b0,ptVar4,&local_90);
    poVar2 = std::operator<<(poVar2,(string *)&local_b0);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  std::operator<<(out,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  generate_cl_struct_internal(this,out,tstruct,false);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = std::operator<<(out,")");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void t_cl_generator::generate_cl_struct(std::ostream& out, t_struct* tstruct, bool is_exception = false) {
  std::string name = type_name(tstruct);
  out << (is_exception ? "(thrift:def-exception " : "(thrift:def-struct ") <<
      prefix(name) << endl;
  indent_up();
  if ( tstruct->has_doc() ) {
    out << indent() ;
    out << "\"" << cl_docstring(tstruct->get_doc()) << "\"" << endl;
  }
  out << indent() ;
  generate_cl_struct_internal(out, tstruct, is_exception);
  indent_down();
  out << ")" << endl << endl;
}